

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  char *__path;
  int iVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  int local_34;
  
  do {
    iVar1 = close(*(int *)((long)child_arg + 8));
    if (iVar1 != -1) {
      UnitTest::GetInstance();
      __path = ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p;
      iVar1 = chdir(__path);
      if (iVar1 != 0) {
        paVar9 = &local_d8.field_2;
        local_d8._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"chdir(\"","");
        pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_d8,__path);
        paVar10 = &local_b8.field_2;
        local_b8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
        paVar7 = &pbVar3->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar7) {
          local_b8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
          local_b8._M_dataplus._M_p = (pointer)paVar10;
        }
        else {
          local_b8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        local_b8._M_string_length = pbVar3->_M_string_length;
        (pbVar3->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar3->_M_string_length = 0;
        (pbVar3->field_2)._M_local_buf[0] = '\0';
        pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_b8,"\") failed: ");
        paVar7 = &local_138.field_2;
        local_138._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
        paVar8 = &pbVar3->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p == paVar8) {
          local_138.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
          local_138._M_dataplus._M_p = (pointer)paVar7;
        }
        else {
          local_138.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_138._M_string_length = pbVar3->_M_string_length;
        (pbVar3->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar3->_M_string_length = 0;
        (pbVar3->field_2)._M_local_buf[0] = '\0';
        GetLastErrnoDescription_abi_cxx11_();
        uVar6 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar7) {
          uVar6 = local_138.field_2._M_allocated_capacity;
        }
        paVar8 = &local_f8.field_2;
        if ((ulong)uVar6 < local_f8._M_string_length + local_138._M_string_length) {
          uVar6 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != paVar8) {
            uVar6 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar6 < local_f8._M_string_length + local_138._M_string_length)
          goto LAB_0014749d;
          pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_f8,0,0,local_138._M_dataplus._M_p,local_138._M_string_length);
        }
        else {
LAB_0014749d:
          pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_138,local_f8._M_dataplus._M_p,local_f8._M_string_length);
        }
        local_118._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
        paVar4 = &pbVar3->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p == paVar4) {
          local_118.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
          local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        }
        else {
          local_118.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        }
        local_118._M_string_length = pbVar3->_M_string_length;
        (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
        pbVar3->_M_string_length = 0;
        paVar4->_M_local_buf[0] = '\0';
        DeathTestAbort(&local_118);
        pbVar3 = extraout_RAX;
        local_b8._M_dataplus._M_p = (pointer)extraout_RDX;
        goto LAB_001476a6;
      }
      execv(**child_arg,*child_arg);
      paVar10 = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"execv(","");
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_78,(char *)**child_arg);
      paVar9 = &local_f8.field_2;
      local_f8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar7 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == paVar7) {
        local_f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_f8._M_dataplus._M_p = (pointer)paVar9;
      }
      else {
        local_f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_f8._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_f8,", ...) in ");
      paVar7 = &local_d8.field_2;
      local_d8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar8 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == paVar8) {
        local_d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_d8._M_dataplus._M_p = (pointer)paVar7;
      }
      else {
        local_d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      local_d8._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_d8,__path);
      paVar8 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar4 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == paVar4) {
        local_b8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_b8._M_dataplus._M_p = (pointer)paVar8;
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      }
      local_b8._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_b8," failed: ");
      local_138._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar4 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == paVar4) {
        local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      }
      local_138._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      GetLastErrnoDescription_abi_cxx11_();
      uVar6 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        uVar6 = local_138.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < local_98._M_string_length + local_138._M_string_length) {
        uVar6 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          uVar6 = local_98.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar6 < local_98._M_string_length + local_138._M_string_length)
        goto LAB_0014765d;
        pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_98,0,0,local_138._M_dataplus._M_p,local_138._M_string_length);
      }
      else {
LAB_0014765d:
        pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_138,local_98._M_dataplus._M_p,local_98._M_string_length);
      }
      local_118._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar4 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p == paVar4) {
        local_118.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      }
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar3->_M_string_length = 0;
      paVar4->_M_local_buf[0] = '\0';
      local_118._M_string_length = (size_type)paVar5;
      DeathTestAbort(&local_118);
      pbVar3 = extraout_RAX_00;
      local_118._M_dataplus._M_p = (pointer)extraout_RDX_00;
      goto LAB_001477bb;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  paVar9 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CHECK failed: File ","");
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_98,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                     );
  paVar10 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar7 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == paVar7) {
    local_78.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_78._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_78.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_78._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_78,", line ");
  paVar7 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar8 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p == paVar8) {
    local_f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_f8._M_dataplus._M_p = (pointer)paVar7;
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_f8._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_34 = 0x4d6;
  StreamableToString<int>(&local_58,&local_34);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar7) {
    uVar6 = local_f8.field_2._M_allocated_capacity;
  }
  paVar8 = &local_58.field_2;
  if ((ulong)uVar6 < local_58._M_string_length + local_f8._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar8) {
      uVar6 = local_58.field_2._M_allocated_capacity;
    }
    if (local_58._M_string_length + local_f8._M_string_length <= (ulong)uVar6) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_58,0,0,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      goto LAB_00147526;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_f8,local_58._M_dataplus._M_p,local_58._M_string_length);
LAB_00147526:
  local_d8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == paVar4) {
    local_d8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_d8._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,": ");
  local_b8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == paVar4) {
    local_b8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
LAB_001476a6:
    local_b8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_b8._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_b8,"close(args->close_fd)");
  local_138._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p == paVar4) {
    local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_138._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_138," != -1");
  paVar5 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p == paVar4) {
    local_118.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_118._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
LAB_001477bb:
    local_118.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_118._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar5) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar8) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar7) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar10) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar9) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execv() as it's almost a direct system call. We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execv() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execv(args->argv[0], args->argv);
  DeathTestAbort(std::string("execv(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " +
                 GetLastErrnoDescription());
  return EXIT_FAILURE;
}